

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Graph<Node>::printMinDistMatrix(Graph<Node> *this,ofstream *fout)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"Roy-Floyd distances:\n\n",0x16);
  if (0 < this->_nodeCnt) {
    lVar3 = 0;
    do {
      if (0 < this->_nodeCnt) {
        lVar2 = 0;
        do {
          poVar1 = (ostream *)
                   std::ostream::operator<<((ostream *)fout,(this->minDist).vect[lVar3].vect[lVar2])
          ;
          uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,(char *)((long)&uStack_38 + 7),1);
          lVar2 = lVar2 + 1;
        } while (lVar2 < this->_nodeCnt);
      }
      uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)fout,(char *)((long)&uStack_38 + 6),1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->_nodeCnt);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"------------------------\n\n",0x1a);
  return;
}

Assistant:

void printMinDistMatrix(std::ofstream &fout) {
        const int Inf = 0x3f3f3f3f;
        fout << "Roy-Floyd distances:\n\n";
        for (int i = 0; i < _nodeCnt; ++i) {
            for (int j = 0; j < _nodeCnt; ++j) {
                fout << minDist[i][j] << ' ';
            }

            fout << '\n';
        }

        fout << "------------------------\n\n";
    }